

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_componentNotEqualByNumberOfComponents_Test::
Equality_componentNotEqualByNumberOfComponents_Test
          (Equality_componentNotEqualByNumberOfComponents_Test *this)

{
  Equality_componentNotEqualByNumberOfComponents_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Equality_componentNotEqualByNumberOfComponents_Test_0014a458;
  return;
}

Assistant:

TEST(Equality, componentNotEqualByNumberOfComponents)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::ComponentPtr cChild1 = libcellml::Component::create("child1");

    c1->addComponent(cChild1);

    EXPECT_FALSE(c1->equals(c2));
    EXPECT_FALSE(c2->equals(c1));
}